

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
* __thiscall
dgrminer::PartialUnion::compute_labeled_nodes
          (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
           *__return_storage_ptr__,PartialUnion *this)

{
  undefined8 uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_> *this_00;
  undefined1 local_38 [8];
  labeled_node_time lnt;
  size_t i;
  PartialUnion *this_local;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  *labeled_nodes;
  
  std::
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::set(__return_storage_ptr__);
  lnt.label = 0;
  lnt.changetime = 0;
  for (; uVar1 = lnt._8_8_,
      sVar2 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                        (&this->nodes), (ulong)uVar1 < sVar2; lnt._8_8_ = lnt._8_8_ + 1) {
    this_00 = &this->nodes;
    pvVar3 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (this_00,lnt._8_8_);
    pvVar4 = std::array<int,_6UL>::operator[](pvVar3,0);
    local_38._0_4_ = *pvVar4;
    pvVar3 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (this_00,lnt._8_8_);
    pvVar4 = std::array<int,_6UL>::operator[](pvVar3,1);
    local_38._4_4_ = *pvVar4;
    pvVar3 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (this_00,lnt._8_8_);
    pvVar4 = std::array<int,_6UL>::operator[](pvVar3,2);
    lnt.time = *pvVar4;
    pvVar3 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (this_00,lnt._8_8_);
    pvVar4 = std::array<int,_6UL>::operator[](pvVar3,4);
    lnt.id = *pvVar4;
    std::
    set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::insert(__return_storage_ptr__,(value_type *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<labeled_node_time> PartialUnion::compute_labeled_nodes()
	{
		std::set<labeled_node_time> labeled_nodes;
		for (size_t i = 0; i < nodes.size(); i++)
		{
			labeled_node_time lnt;
			lnt.time = nodes[i][PN_TIME];
			lnt.id = nodes[i][PN_ID];
			lnt.label = nodes[i][PN_LABEL];
			lnt.changetime = nodes[i][PN_CHANGETIME];
			labeled_nodes.insert(lnt);
		}
		return labeled_nodes;
	}